

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O0

QCborValue * __thiscall QJsonPrivate::Parser::parseNumber(Parser *this)

{
  enable_if_t<std::is_integral_v<long_long>,_bool> eVar1;
  qlonglong i;
  QByteArray *in_RSI;
  QCborValue *in_RDI;
  long in_FS_OFFSET;
  double v;
  double d;
  qlonglong n_1;
  bool isInt;
  char *start;
  qint64 n;
  bool ok;
  bool ok_1;
  QByteArray number;
  undefined4 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7c;
  undefined1 in_stack_ffffffffffffff7d;
  undefined1 in_stack_ffffffffffffff7e;
  bool bVar2;
  undefined1 in_stack_ffffffffffffff7f;
  QCborValue *this_00;
  char *in_stack_ffffffffffffff98;
  bool local_49;
  longlong local_30;
  byte local_22;
  byte local_21;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_49 = true;
  if (((in_RSI->d).ptr < (char *)(in_RSI->d).size) && (*(in_RSI->d).ptr == '-')) {
    (in_RSI->d).ptr = (in_RSI->d).ptr + 1;
  }
  this_00 = in_RDI;
  if (((in_RSI->d).ptr < (char *)(in_RSI->d).size) && (*(in_RSI->d).ptr == '0')) {
    (in_RSI->d).ptr = (in_RSI->d).ptr + 1;
  }
  else {
    while( true ) {
      bVar2 = false;
      if ((in_RSI->d).ptr < (char *)(in_RSI->d).size) {
        bVar2 = QtMiscUtils::isAsciiDigit((int)*(in_RSI->d).ptr);
      }
      if (bVar2 == false) break;
      (in_RSI->d).ptr = (in_RSI->d).ptr + 1;
    }
    in_stack_ffffffffffffff7f = 0;
  }
  if (((in_RSI->d).ptr < (char *)(in_RSI->d).size) && (*(in_RSI->d).ptr == '.')) {
    (in_RSI->d).ptr = (in_RSI->d).ptr + 1;
    while( true ) {
      bVar2 = false;
      if ((in_RSI->d).ptr < (char *)(in_RSI->d).size) {
        bVar2 = QtMiscUtils::isAsciiDigit((int)*(in_RSI->d).ptr);
      }
      if (bVar2 == false) break;
      in_stack_ffffffffffffff7d = false;
      if (local_49 != false) {
        in_stack_ffffffffffffff7d = *(in_RSI->d).ptr == '0';
      }
      (in_RSI->d).ptr = (in_RSI->d).ptr + 1;
      local_49 = (bool)in_stack_ffffffffffffff7d;
    }
    in_stack_ffffffffffffff7e = 0;
  }
  if (((in_RSI->d).ptr < (char *)(in_RSI->d).size) &&
     ((*(in_RSI->d).ptr == 'e' || (*(in_RSI->d).ptr == 'E')))) {
    local_49 = false;
    (in_RSI->d).ptr = (in_RSI->d).ptr + 1;
    if (((in_RSI->d).ptr < (char *)(in_RSI->d).size) &&
       ((*(in_RSI->d).ptr == '-' || (*(in_RSI->d).ptr == '+')))) {
      (in_RSI->d).ptr = (in_RSI->d).ptr + 1;
    }
    while( true ) {
      bVar2 = false;
      if ((in_RSI->d).ptr < (char *)(in_RSI->d).size) {
        bVar2 = QtMiscUtils::isAsciiDigit((int)*(in_RSI->d).ptr);
      }
      if (bVar2 == false) break;
      (in_RSI->d).ptr = (in_RSI->d).ptr + 1;
    }
    in_stack_ffffffffffffff7c = 0;
  }
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QByteArray::fromRawData(in_stack_ffffffffffffff98,(qsizetype)in_RSI);
  if (local_49 != false) {
    local_21 = 0xaa;
    i = QByteArray::toLongLong(in_RSI,(bool *)this_00,(int)((ulong)in_RDI >> 0x20));
    if ((local_21 & 1) != 0) {
      QCborValue::QCborValue(in_RDI,i);
      goto LAB_00138eb6;
    }
  }
  local_22 = 0xaa;
  v = QByteArray::toDouble((QByteArray *)this_00,(bool *)in_RDI);
  if ((local_22 & 1) == 0) {
    *(undefined4 *)((long)&in_RSI[1].d.d + 4) = 7;
    QCborValue::QCborValue(in_RDI);
  }
  else {
    local_30 = -0x5555555555555556;
    eVar1 = anon_unknown.dwarf_1ac83d::convertDoubleTo<long_long>(v,&local_30,true);
    if (eVar1) {
      QCborValue::QCborValue(in_RDI,local_30);
    }
    else {
      QCborValue::QCborValue
                ((QCborValue *)0x138eae,
                 (double)CONCAT17(in_stack_ffffffffffffff7f,
                                  CONCAT16(in_stack_ffffffffffffff7e,
                                           CONCAT15(in_stack_ffffffffffffff7d,
                                                    CONCAT14(in_stack_ffffffffffffff7c,
                                                             in_stack_ffffffffffffff78)))));
    }
  }
LAB_00138eb6:
  QByteArray::~QByteArray((QByteArray *)0x138ec0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

QCborValue Parser::parseNumber()
{
    const char *start = json;
    bool isInt = true;

    // minus
    if (json < end && *json == '-')
        ++json;

    // int = zero / ( digit1-9 *DIGIT )
    if (json < end && *json == '0') {
        ++json;
    } else {
        while (json < end && isAsciiDigit(*json))
            ++json;
    }

    // frac = decimal-point 1*DIGIT
    if (json < end && *json == '.') {
        ++json;
        while (json < end && isAsciiDigit(*json)) {
            isInt = isInt && *json == '0';
            ++json;
        }
    }

    // exp = e [ minus / plus ] 1*DIGIT
    if (json < end && (*json == 'e' || *json == 'E')) {
        isInt = false;
        ++json;
        if (json < end && (*json == '-' || *json == '+'))
            ++json;
        while (json < end && isAsciiDigit(*json))
            ++json;
    }

    const QByteArray number = QByteArray::fromRawData(start, json - start);

    if (isInt) {
        bool ok;
        qlonglong n = number.toLongLong(&ok);
        if (ok) {
            return QCborValue(n);
        }
    }

    bool ok;
    double d = number.toDouble(&ok);

    if (!ok) {
        lastError = QJsonParseError::IllegalNumber;
        return QCborValue();
    }

    qint64 n;
    if (convertDoubleTo(d, &n))
        return QCborValue(n);
    return QCborValue(d);
}